

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_c_model.c
# Opt level: O1

void PrintSolution_C(CAPIExample *pex,char *stub)

{
  long lVar1;
  
  printf("\n     ********** SOLUTION (%s.sol) ***********\n");
  puts("DUALS.");
  if (0 < pex->n_con) {
    lVar1 = 0;
    do {
      printf("   %10s = %.17g\n",pex->sol_dual_[lVar1],pex->con_name[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < pex->n_con);
  }
  puts("PRIMALS.");
  if (0 < pex->n_con) {
    lVar1 = 0;
    do {
      printf("      %7s = %.17g\n",pex->sol_primal_[lVar1],pex->var_name[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < pex->n_con);
  }
  printf("\nObjno used: %d, solve_result_num: %d\n",(ulong)(pex->objno_ + 1),
         (ulong)(uint)pex->solve_code_);
  return;
}

Assistant:

void PrintSolution_C(CAPIExample* pex, const char* stub) {
  printf(
        "\n     ********** SOLUTION (%s.sol) ***********\n",
        stub);
  printf("%s\n", "DUALS.");
  for (int i=0; i<pex->n_con; ++i)
    printf("   %10s = %.17g\n",
           pex->con_name[i], pex->sol_dual_[i]);
  printf("%s\n", "PRIMALS.");
  for (int i=0; i<pex->n_con; ++i)
    printf("      %7s = %.17g\n",
           pex->var_name[i], pex->sol_primal_[i]);

  printf("\nObjno used: %d, solve_result_num: %d\n",
         pex->objno_+1, pex->solve_code_);
}